

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::DisposableOwnedBundle<kj::Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>_>
::disposeImpl(DisposableOwnedBundle<kj::Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>_>
              *this,void *pointer)

{
  uint *puVar1;
  ForkHub<kj::Rc<kj::Refcounted>_> *node;
  
  node = (this->
         super_OwnedBundle<kj::Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>_>).
         first.ptr;
  if (node != (ForkHub<kj::Rc<kj::Refcounted>_> *)0x0) {
    (this->super_OwnedBundle<kj::Own<kj::_::ForkHub<kj::Rc<kj::Refcounted>_>,_kj::_::ForkHubBase>_>)
    .first.ptr = (ForkHub<kj::Rc<kj::Refcounted>_> *)0x0;
    puVar1 = &(node->super_ForkHubBase).refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
  }
  operator_delete(this,0x10);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override { delete this; }